

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_file_handle_clone_cmp_func_list(fdb_file_handle *fhandle,list *cmp_func_list)

{
  list_elem *plVar1;
  list *plVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *__dest;
  list_elem *plVar5;
  
  if ((cmp_func_list != (list *)0x0) && (fhandle->cmp_func_list == (list *)0x0)) {
    plVar2 = (list *)calloc(1,0x10);
    fhandle->cmp_func_list = plVar2;
    plVar2->head = (list_elem *)0x0;
    plVar2->tail = (list_elem *)0x0;
    for (plVar5 = cmp_func_list->head; plVar5 != (list_elem *)0x0; plVar5 = plVar5->next) {
      puVar3 = (undefined8 *)calloc(1,0x28);
      if (plVar5[-2].next == (list_elem *)0x0) {
        *puVar3 = 0;
      }
      else {
        sVar4 = strlen((char *)plVar5[-2].next);
        __dest = (char *)calloc(1,sVar4 + 1);
        *puVar3 = __dest;
        strcpy(__dest,(char *)plVar5[-2].next);
      }
      plVar1 = plVar5[-1].next;
      puVar3[1] = plVar5[-1].prev;
      puVar3[2] = plVar1;
      list_push_back(fhandle->cmp_func_list,(list_elem *)(puVar3 + 3));
    }
  }
  return;
}

Assistant:

void fdb_file_handle_clone_cmp_func_list(fdb_file_handle *fhandle,
                                         struct list *cmp_func_list)
{
    struct list_elem *e;
    struct cmp_func_node *src, *dst;

    if (fhandle->cmp_func_list || /* already exist */
        !cmp_func_list) {
        return;
    }

    fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(fhandle->cmp_func_list);

    e = list_begin(cmp_func_list);
    while (e) {
        src = _get_entry(e, struct cmp_func_node, le);
        dst = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        if (src->kvs_name) {
            dst->kvs_name = (char*)calloc(1, strlen(src->kvs_name)+1);
            strcpy(dst->kvs_name, src->kvs_name);
        } else {
            dst->kvs_name = NULL; // default KVS
        }
        dst->func = src->func;
        dst->user_param = src->user_param;
        list_push_back(fhandle->cmp_func_list, &dst->le);
        e = list_next(&src->le);
    }
}